

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HVectorBase.cpp
# Opt level: O0

void __thiscall HVectorBase<HighsCDouble>::setup(HVectorBase<HighsCDouble> *this,HighsInt size_)

{
  undefined4 in_ESI;
  undefined4 *in_RDI;
  size_type in_stack_ffffffffffffffb8;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> *this_00;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar1;
  uint in_stack_ffffffffffffffdc;
  uint uVar2;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> *in_stack_ffffffffffffffe0;
  
  *in_RDI = in_ESI;
  in_RDI[1] = 0;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffe0,
             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  this_00 = (vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)(in_RDI + 8);
  HighsCDouble::HighsCDouble((HighsCDouble *)&stack0xffffffffffffffe0,0.0);
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::assign
            (this_00,in_stack_ffffffffffffffb8,(value_type *)0x7f786d);
  uVar2 = in_stack_ffffffffffffffdc & 0xffffff;
  std::vector<char,_std::allocator<char>_>::assign
            ((vector<char,_std::allocator<char>_> *)this_00,in_stack_ffffffffffffffb8,
             (value_type_conflict *)0x7f7892);
  uVar1 = 0;
  std::vector<int,_std::allocator<int>_>::assign
            ((vector<int,_std::allocator<int>_> *)this_00,in_stack_ffffffffffffffb8,
             (value_type_conflict2 *)0x7f78b8);
  in_RDI[0x1f] = 0;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffe0,CONCAT44(uVar2,uVar1));
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::resize
            (in_stack_ffffffffffffffe0,CONCAT44(uVar2,uVar1));
  *(undefined1 *)(in_RDI + 0x1e) = 0;
  *(undefined8 *)(in_RDI + 0xe) = 0;
  *(undefined8 *)(in_RDI + 0x1c) = 0;
  return;
}

Assistant:

void HVectorBase<Real>::setup(HighsInt size_) {
  /*
   * Initialise an HVector instance
   */
  size = size_;
  count = 0;
  index.resize(size);
  array.assign(size, Real{0});
  cwork.assign(size + 6400, 0);  // MAX invert
  iwork.assign(size * 4, 0);

  packCount = 0;
  packIndex.resize(size);
  packValue.resize(size);

  // Initialise three values that are initialised in clear(), but
  // weren't originally initialised in setup(). Probably doesn't
  // matter, since clear() is usually called before a vector is
  // (re-)used.
  packFlag = false;
  synthetic_tick = 0;
  next = 0;
}